

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

void MA_print_stats(Boolean printroutines)

{
  long lVar1;
  
  ma_stats.calls[0x15] = ma_stats.calls[0x15] + 1;
  puts("MA usage statistics:");
  puts("\n\tallocation statistics:");
  puts("\t\t\t\t\t      heap\t     stack");
  puts("\t\t\t\t\t      ----\t     -----");
  printf("\tcurrent number of blocks\t%10lu\t%10lu\n",ma_stats.hblocks,ma_stats.sblocks);
  printf("\tmaximum number of blocks\t%10lu\t%10lu\n",ma_stats.hblocks_max,ma_stats.sblocks_max);
  printf("\tcurrent total bytes\t\t%10lu\t%10lu\n",ma_stats.hbytes,ma_stats.sbytes);
  printf("\tmaximum total bytes\t\t%10lu\t%10lu\n",ma_stats.hbytes_max,ma_stats.sbytes_max);
  printf("\tmaximum total K-bytes\t\t%10lu\t%10lu\n",(ma_stats.hbytes_max + 999) / 1000,
         (ma_stats.sbytes_max + 999) / 1000);
  printf("\tmaximum total M-bytes\t\t%10lu\t%10lu\n",(ma_stats.hbytes_max + 999999) / 1000000,
         (ma_stats.sbytes_max + 999999) / 1000000);
  if (printroutines != 0) {
    puts("\n\tcalls per routine:");
    for (lVar1 = 0; lVar1 != 0x84; lVar1 = lVar1 + 4) {
      printf("\t\t%10lu  %s\n",*(undefined8 *)((long)ma_stats.calls + lVar1 * 2),
             (long)&ma_routines_rel + (long)*(int *)((long)&ma_routines_rel + lVar1));
    }
  }
  return;
}

Assistant:

public void MA_print_stats(Boolean printroutines)
{
#ifdef STATS

    int        i;        /* loop index */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_print_stats]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return;
#endif /* VERIFY */

    (void)printf("MA usage statistics:\n");
    (void)printf("\n\tallocation statistics:\n");
    (void)printf("\t\t\t\t\t      heap\t     stack\n");
    (void)printf("\t\t\t\t\t      ----\t     -----\n");
    (void)printf("\tcurrent number of blocks\t%10lu\t%10lu\n",
        ma_stats.hblocks,
        ma_stats.sblocks);
    (void)printf("\tmaximum number of blocks\t%10lu\t%10lu\n",
        ma_stats.hblocks_max,
        ma_stats.sblocks_max);
    (void)printf("\tcurrent total bytes\t\t%10lu\t%10lu\n",
        ma_stats.hbytes,
        ma_stats.sbytes);
    (void)printf("\tmaximum total bytes\t\t%10lu\t%10lu\n",
        ma_stats.hbytes_max,
        ma_stats.sbytes_max);
    (void)printf("\tmaximum total K-bytes\t\t%10lu\t%10lu\n",
        ((ma_stats.hbytes_max+999)/1000),
        ((ma_stats.sbytes_max+999)/1000));
    (void)printf("\tmaximum total M-bytes\t\t%10lu\t%10lu\n",
        ((ma_stats.hbytes_max+999999)/1000000),
        ((ma_stats.sbytes_max+999999)/1000000));
    if (printroutines)
    {
        (void)printf("\n\tcalls per routine:\n");
        for (i = 0; i < NUMROUTINES; i++)
            (void)printf("\t\t%10lu  %s\n",
                ma_stats.calls[i],
                ma_routines[i]);
    }

#else

    (void)sprintf(ma_ebuf,
        "unavailable; recompile MA with -DSTATS");
    ma_error(EL_Nonfatal, ET_External, "MA_print_stats", ma_ebuf);

#endif /* STATS */
}